

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

void __thiscall QRegularExpressionPrivate::compilePattern(QRegularExpressionPrivate *this)

{
  QMutex *this_00;
  __pointer_type copy;
  uint uVar1;
  pcre2_code_16 *ppVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  size_t patternErrorOffset;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar4 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_003fbee6;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_003fbee6:
  if (this->isDirty == true) {
    this->isDirty = false;
    pcre2_code_free_16(this->compiledPattern);
    this->compiledPattern = (pcre2_code_16 *)0x0;
    this->errorCode = 0;
    this->errorOffset = -1;
    this->capturingCount = 0;
    this->usingCrLfNewlines = false;
    uVar1 = (this->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
            super_QFlagsStorage<QRegularExpression::PatternOption>.i;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (this->pattern).d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = L"";
    }
    ppVar2 = (pcre2_code_16 *)
             pcre2_compile_16(pcVar3,(this->pattern).d.size,
                              (uVar1 << 4 & 0x20) + (uVar1 & 1) * 8 | uVar1 << 8 & 0x400 |
                              uVar1 << 4 & 0x80 | (uVar1 & 0x10) << 0xe | uVar1 << 8 & 0x2000 |
                              (uVar1 & 0x40) << 0xb | 0x80000,&this->errorCode,&local_28,0);
    this->compiledPattern = ppVar2;
    if (ppVar2 == (pcre2_code_16 *)0x0) {
      this->errorOffset = (qsizetype)local_28;
    }
    else {
      this->errorCode = 0;
      optimizePattern(this);
      getPatternInfo(this);
    }
  }
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRegularExpressionPrivate::compilePattern()
{
    const QMutexLocker lock(&mutex);

    if (!isDirty)
        return;

    isDirty = false;
    cleanCompiledPattern();

    int options = convertToPcreOptions(patternOptions);
    options |= PCRE2_UTF;

    PCRE2_SIZE patternErrorOffset;
    compiledPattern = pcre2_compile_16(reinterpret_cast<PCRE2_SPTR16>(pattern.constData()),
                                       pattern.size(),
                                       options,
                                       &errorCode,
                                       &patternErrorOffset,
                                       nullptr);

    if (!compiledPattern) {
        errorOffset = qsizetype(patternErrorOffset);
        return;
    } else {
        // ignore whatever PCRE2 wrote into errorCode -- leave it to 0 to mean "no error"
        errorCode = 0;
    }

    optimizePattern();
    getPatternInfo();
}